

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote.cpp
# Opt level: O2

void __thiscall remote::Handle::ParseMaps(Handle *this)

{
  int iVar1;
  istream *piVar2;
  long lVar3;
  size_t ls;
  long lVar4;
  size_t i;
  ulong uVar5;
  string pathname;
  string device;
  string memorySpace;
  string local_660 [32];
  vector<remote::MapModuleMemoryRegion,_std::allocator<remote::MapModuleMemoryRegion>_> *local_640;
  string inode;
  string offset;
  string permissions;
  string line;
  MapModuleMemoryRegion region;
  stringstream ss;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_530;
  uint auStack_518 [88];
  istringstream iss;
  ifstream maps;
  
  local_640 = &this->regions;
  std::vector<remote::MapModuleMemoryRegion,_std::allocator<remote::MapModuleMemoryRegion>_>::clear
            (local_640);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&iss,"/proc/",
                 &this->pidStr);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&iss,"/maps");
  std::ifstream::ifstream(&maps,(string *)&ss,_S_in);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::~string((string *)&iss);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&maps,(string *)&line);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)&line,_S_in);
    memorySpace._M_dataplus._M_p = (pointer)&memorySpace.field_2;
    memorySpace._M_string_length = 0;
    memorySpace.field_2._M_local_buf[0] = '\0';
    permissions._M_dataplus._M_p = (pointer)&permissions.field_2;
    permissions._M_string_length = 0;
    offset._M_dataplus._M_p = (pointer)&offset.field_2;
    offset._M_string_length = 0;
    device._M_dataplus._M_p = (pointer)&device.field_2;
    device._M_string_length = 0;
    permissions.field_2._M_local_buf[0] = '\0';
    offset.field_2._M_local_buf[0] = '\0';
    device.field_2._M_local_buf[0] = '\0';
    inode._M_dataplus._M_p = (pointer)&inode.field_2;
    inode._M_string_length = 0;
    inode.field_2._M_local_buf[0] = '\0';
    piVar2 = std::operator>>((istream *)&iss,(string *)&memorySpace);
    piVar2 = std::operator>>(piVar2,(string *)&permissions);
    piVar2 = std::operator>>(piVar2,(string *)&offset);
    piVar2 = std::operator>>(piVar2,(string *)&device);
    piVar2 = std::operator>>(piVar2,(string *)&inode);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0) {
      pathname._M_dataplus._M_p = (pointer)&pathname.field_2;
      pathname._M_string_length = 0;
      pathname.field_2._M_local_buf[0] = '\0';
      lVar4 = 0;
      for (uVar5 = 0; uVar5 < line._M_string_length; uVar5 = uVar5 + 1) {
        std::__cxx11::string::substr((ulong)&ss,(ulong)&line);
        iVar1 = std::__cxx11::string::compare((char *)&ss);
        std::__cxx11::string::~string((string *)&ss);
        if ((iVar1 == 0) && (lVar4 = lVar4 + 1, lVar4 == 5)) {
          std::__cxx11::string::substr((ulong)&ss,(ulong)&line);
          lVar4 = std::__cxx11::string::find_first_not_of((char)(string *)&ss,0x20);
          std::__cxx11::string::~string((string *)&ss);
          if (lVar4 == -1) {
            pathname._M_string_length = 0;
            *pathname._M_dataplus._M_p = '\0';
          }
          else {
            std::__cxx11::string::substr((ulong)&ss,(ulong)&line);
            std::__cxx11::string::operator=((string *)&pathname,(string *)&ss);
            std::__cxx11::string::~string((string *)&ss);
          }
          lVar4 = 5;
        }
      }
      region.pathname._M_dataplus._M_p = (pointer)&region.pathname.field_2;
      region.pathname._M_string_length = 0;
      region.pathname.field_2._M_local_buf[0] = '\0';
      region.filename._M_dataplus._M_p = (pointer)&region.filename.field_2;
      region.filename._M_string_length = 0;
      region.filename.field_2._M_local_buf[0] = '\0';
      lVar4 = std::__cxx11::string::find((char)&memorySpace,0x2d);
      lVar3 = std::__cxx11::string::find((char)&device,0x3a);
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      iVar1 = (int)(string *)&ss;
      if (lVar4 != -1) {
        *(uint *)((long)auStack_518 + *(long *)(local_530._M_allocated_capacity - 0x18)) =
             *(uint *)((long)auStack_518 + *(long *)(local_530._M_allocated_capacity - 0x18)) &
             0xffffffb5 | 8;
        std::__cxx11::string::substr((ulong)local_660,(ulong)&memorySpace);
        std::operator<<((ostream *)local_530._M_local_buf,local_660);
        std::__cxx11::string::~string(local_660);
        std::istream::_M_extract<unsigned_long>((ulong *)&ss);
        std::ios::clear((int)*(undefined8 *)(_ss + -0x18) + iVar1);
        *(uint *)((long)auStack_518 + *(long *)(local_530._M_allocated_capacity - 0x18)) =
             *(uint *)((long)auStack_518 + *(long *)(local_530._M_allocated_capacity - 0x18)) &
             0xffffffb5 | 8;
        std::__cxx11::string::substr((ulong)local_660,(ulong)&memorySpace);
        std::operator<<((ostream *)local_530._M_local_buf,local_660);
        std::__cxx11::string::~string(local_660);
        std::istream::_M_extract<unsigned_long>((ulong *)&ss);
        std::ios::clear((int)*(undefined8 *)(_ss + -0x18) + iVar1);
      }
      if (lVar3 != -1) {
        *(uint *)((long)auStack_518 + *(long *)(local_530._M_allocated_capacity - 0x18)) =
             *(uint *)((long)auStack_518 + *(long *)(local_530._M_allocated_capacity - 0x18)) &
             0xffffffb5 | 8;
        std::__cxx11::string::substr((ulong)local_660,(ulong)&device);
        std::operator<<((ostream *)local_530._M_local_buf,local_660);
        std::__cxx11::string::~string(local_660);
        std::operator>>((istream *)&ss,(char *)&region.deviceMajor);
        std::ios::clear((int)*(undefined8 *)(_ss + -0x18) + iVar1);
        *(uint *)((long)auStack_518 + *(long *)(local_530._M_allocated_capacity - 0x18)) =
             *(uint *)((long)auStack_518 + *(long *)(local_530._M_allocated_capacity - 0x18)) &
             0xffffffb5 | 8;
        std::__cxx11::string::substr((ulong)local_660,(ulong)&device);
        std::operator<<((ostream *)local_530._M_local_buf,local_660);
        std::__cxx11::string::~string(local_660);
        std::operator>>((istream *)&ss,(char *)&region.deviceMinor);
        std::ios::clear((int)*(undefined8 *)(_ss + -0x18) + iVar1);
      }
      *(uint *)((long)auStack_518 + *(long *)(local_530._M_allocated_capacity - 0x18)) =
           *(uint *)((long)auStack_518 + *(long *)(local_530._M_allocated_capacity - 0x18)) &
           0xffffffb5 | 8;
      std::operator<<((ostream *)local_530._M_local_buf,(string *)&offset);
      std::istream::_M_extract<unsigned_long>((ulong *)&ss);
      std::ios::clear((int)*(undefined8 *)(_ss + -0x18) + iVar1);
      std::operator<<((ostream *)local_530._M_local_buf,(string *)&inode);
      std::istream::_M_extract<unsigned_long>((ulong *)&ss);
      region.readable = *permissions._M_dataplus._M_p == 'r';
      region.writable = permissions._M_dataplus._M_p[1] == 'w';
      region.executable = permissions._M_dataplus._M_p[2] == 'x';
      region.shared = permissions._M_dataplus._M_p[3] != '-';
      if (pathname._M_string_length != 0) {
        std::__cxx11::string::_M_assign((string *)&region.pathname);
        lVar4 = std::__cxx11::string::rfind((char)&pathname,0x2f);
        if (lVar4 != -1) {
          std::__cxx11::string::substr((ulong)local_660,(ulong)&pathname);
          std::__cxx11::string::operator=((string *)&region.filename,local_660);
          std::__cxx11::string::~string(local_660);
        }
      }
      std::vector<remote::MapModuleMemoryRegion,_std::allocator<remote::MapModuleMemoryRegion>_>::
      push_back(local_640,&region);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      MapModuleMemoryRegion::~MapModuleMemoryRegion(&region);
      std::__cxx11::string::~string((string *)&pathname);
    }
    std::__cxx11::string::~string((string *)&inode);
    std::__cxx11::string::~string((string *)&device);
    std::__cxx11::string::~string((string *)&offset);
    std::__cxx11::string::~string((string *)&permissions);
    std::__cxx11::string::~string((string *)&memorySpace);
    std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
  }
  std::__cxx11::string::~string((string *)&line);
  std::ifstream::~ifstream(&maps);
  return;
}

Assistant:

void Handle::ParseMaps() {
        regions.clear();

        std::ifstream maps("/proc/" + pidStr + "/maps");

        std::string line;
        while (std::getline(maps, line)) {
            std::istringstream iss(line);
            std::string memorySpace, permissions, offset, device, inode;
            if (iss >> memorySpace >> permissions >> offset >> device >> inode) {
                std::string pathname;

                for(size_t ls = 0, i = 0; i < line.length(); i++) {
                    if(line.substr(i, 1).compare(" ") == 0) {
                        ls++;

                        if(ls == 5) {
                            size_t begin = line.substr(i, line.size()).find_first_not_of(' ');

                            if(begin != -1) {
                                pathname = line.substr(begin + i, line.size());
                            } else {
                                pathname.clear();
                            }
                        }
                    }
                }

                MapModuleMemoryRegion region;

                size_t memorySplit = memorySpace.find_first_of('-');
                size_t deviceSplit = device.find_first_of(':');

                std::stringstream ss;

                if(memorySplit != -1) {
                    ss << std::hex << memorySpace.substr(0, memorySplit);
                    ss >> region.start;
                    ss.clear();
                    ss << std::hex << memorySpace.substr(memorySplit + 1, memorySpace.size());
                    ss >> region.end;
                    ss.clear();
                }

                if(deviceSplit != -1) {
                    ss << std::hex << device.substr(0, deviceSplit);
                    ss >> region.deviceMajor;
                    ss.clear();
                    ss << std::hex << device.substr(deviceSplit + 1, device.size());
                    ss >> region.deviceMinor;
                    ss.clear();
                }

                ss << std::hex << offset;
                ss >> region.offset;
                ss.clear();
                ss << inode;
                ss >> region.inodeFileNumber;

                region.readable = (permissions[0] == 'r');
                region.writable = (permissions[1] == 'w');
                region.executable = (permissions[2] == 'x');
                region.shared = (permissions[3] != '-');

                if(!pathname.empty()) {
                    region.pathname = pathname;

                    size_t fileNameSplit = pathname.find_last_of('/');

                    if(fileNameSplit != -1) {
                        region.filename = pathname.substr(fileNameSplit + 1, pathname.size());
                    }
                }

                regions.push_back(region);
            }
        }
    }